

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution3d.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution3D::forward(Convolution3D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  void *pvVar8;
  int *piVar9;
  Convolution3D *pCVar10;
  Mat *pMVar11;
  int iVar12;
  pointer piVar13;
  uint uVar14;
  uint _w;
  long lVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  int l;
  int iVar19;
  ulong uVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  Mat bottom_blob_bordered;
  vector<int,_std::allocator<int>_> _space_ofs;
  Option opt_pad;
  allocator_type local_1a1;
  Option *local_1a0;
  long local_198;
  ulong local_190;
  Convolution3D *local_188;
  ulong local_180;
  ulong local_178;
  float *local_170;
  long local_168;
  void *local_160;
  Mat *local_158;
  int local_14c;
  ulong local_148;
  ulong local_140;
  ulong local_138;
  ulong local_130;
  Mat local_128;
  long local_e0;
  void *local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  vector<int,_std::allocator<int>_> local_a0;
  undefined1 local_88 [16];
  Option local_78;
  
  uVar2 = bottom_blob->c;
  pvVar8 = (void *)bottom_blob->elemsize;
  iVar3 = this->kernel_w;
  iVar4 = this->kernel_h;
  iVar5 = this->dilation_w;
  iVar6 = this->dilation_h;
  iVar7 = this->kernel_d;
  iVar16 = this->dilation_d;
  local_128.cstep = 0;
  local_128.data = (void *)0x0;
  local_128.refcount._0_4_ = 0;
  local_128.refcount._4_4_ = 0;
  local_128.elemsize._0_4_ = 0;
  local_128.elemsize._4_4_ = 0;
  local_128.elempack = 0;
  local_128.allocator = (Allocator *)0x0;
  local_128.dims = 0;
  local_128.w = 0;
  local_128.h = 0;
  local_128.d = 0;
  local_128.c = 0;
  local_78.lightmode = opt->lightmode;
  local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
  local_78.num_threads = opt->num_threads;
  local_78.blob_allocator = opt->blob_allocator;
  local_78.workspace_allocator = opt->workspace_allocator;
  local_78.openmp_blocktime = opt->openmp_blocktime;
  local_78.use_winograd_convolution = opt->use_winograd_convolution;
  local_78.use_sgemm_convolution = opt->use_sgemm_convolution;
  local_78.use_int8_inference = opt->use_int8_inference;
  local_78.use_vulkan_compute = opt->use_vulkan_compute;
  uVar23._0_1_ = opt->use_bf16_storage;
  uVar23._1_1_ = opt->use_fp16_packed;
  uVar23._2_1_ = opt->use_fp16_storage;
  uVar23._3_1_ = opt->use_fp16_arithmetic;
  uVar23._4_1_ = opt->use_int8_packed;
  uVar23._5_1_ = opt->use_int8_storage;
  uVar23._6_1_ = opt->use_int8_arithmetic;
  uVar23._7_1_ = opt->use_packing_layout;
  local_78.use_shader_pack8 = opt->use_shader_pack8;
  local_78.use_subgroup_basic = opt->use_subgroup_basic;
  local_78.use_subgroup_vote = opt->use_subgroup_vote;
  local_78.use_subgroup_ballot = opt->use_subgroup_ballot;
  local_78.use_subgroup_shuffle = opt->use_subgroup_shuffle;
  local_78.use_image_storage = opt->use_image_storage;
  local_78.use_tensor_storage = opt->use_tensor_storage;
  local_78.use_weight_fp16_storage = opt->use_weight_fp16_storage;
  local_78.flush_denormals = opt->flush_denormals;
  local_78.use_local_pool_allocator = opt->use_local_pool_allocator;
  local_78.use_reserved_1 = opt->use_reserved_1;
  local_78.use_reserved_2 = opt->use_reserved_2;
  local_78.use_reserved_3 = opt->use_reserved_3;
  local_78.use_reserved_4 = opt->use_reserved_4;
  local_78.use_reserved_5 = opt->use_reserved_5;
  local_78.use_reserved_6 = opt->use_reserved_6;
  local_78.use_reserved_7 = opt->use_reserved_7;
  local_78.use_reserved_8 = opt->use_reserved_8;
  local_78.use_reserved_9 = opt->use_reserved_9;
  local_78.use_reserved_10 = opt->use_reserved_10;
  local_78.use_reserved_11 = opt->use_reserved_11;
  local_78._32_8_ = uVar23 & 0xffffffffffffff;
  local_1a0 = opt;
  local_188 = this;
  make_padding(this,bottom_blob,&local_128,&local_78);
  iVar12 = local_128.h;
  pCVar10 = local_188;
  iVar18 = -100;
  if ((local_128.data != (void *)0x0) && ((long)local_128.c * local_128.cstep != 0)) {
    local_168 = CONCAT44(local_168._4_4_,local_128.w);
    local_140 = (long)(~((iVar3 + -1) * iVar5) + local_128.w) / (long)local_188->stride_w &
                0xffffffff;
    uVar23 = (long)(~((iVar4 + -1) * iVar6) + local_128.h) / (long)local_188->stride_h;
    uVar24 = (long)(~((iVar7 + -1) * iVar16) + local_128.d) / (long)local_188->stride_d;
    uVar14 = local_188->kernel_w * local_188->kernel_h * local_188->kernel_d;
    local_160 = pvVar8;
    local_158 = top_blob;
    std::vector<int,_std::allocator<int>_>::vector(&local_a0,(long)(int)uVar14,&local_1a1);
    piVar13 = local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
    uVar17 = local_140;
    pMVar11 = local_158;
    _w = (int)local_140 + 1;
    if (0 < pCVar10->kernel_d) {
      iVar3 = pCVar10->dilation_w;
      iVar4 = pCVar10->dilation_h;
      iVar5 = pCVar10->kernel_w;
      iVar6 = pCVar10->kernel_h;
      iVar7 = pCVar10->dilation_d;
      iVar16 = 0;
      iVar18 = 0;
      iVar19 = 0;
      do {
        if (0 < pCVar10->kernel_h) {
          iVar21 = 0;
          do {
            if (0 < pCVar10->kernel_w) {
              lVar22 = 0;
              do {
                local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar19 + lVar22] = iVar18;
                iVar18 = iVar18 + pCVar10->dilation_w;
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 < pCVar10->kernel_w);
              iVar19 = iVar19 + (int)lVar22;
            }
            iVar18 = iVar18 + (iVar4 * (int)local_168 - iVar3 * iVar5);
            iVar21 = iVar21 + 1;
          } while (iVar21 < pCVar10->kernel_h);
        }
        iVar18 = iVar18 + (iVar12 * iVar7 - iVar4 * iVar6) * (int)local_168;
        iVar16 = iVar16 + 1;
      } while (iVar16 < pCVar10->kernel_d);
    }
    local_148 = uVar24 & 0xffffffff;
    local_138 = uVar23 & 0xffffffff;
    Mat::create(local_158,_w,(int)uVar23 + 1,(int)uVar24 + 1,pCVar10->num_output,(size_t)local_160,
                local_1a0->blob_allocator);
    iVar18 = -100;
    if ((pMVar11->data != (void *)0x0) && ((long)pMVar11->c * pMVar11->cstep != 0)) {
      local_d0 = (long)pCVar10->num_output;
      if (0 < local_d0) {
        local_d8 = pMVar11->data;
        local_c0 = (long)(int)_w;
        local_e0 = pMVar11->cstep * pMVar11->elemsize;
        uVar23 = (ulong)_w;
        local_14c = uVar2 * uVar14;
        local_190 = 0;
        local_198 = 0;
        local_130 = uVar23;
        do {
          if (-1 < (int)local_148) {
            local_c8 = (long)(int)local_190 << 2;
            local_1a0 = (Option *)(local_e0 * local_198 + (long)local_d8);
            local_180 = 0;
            do {
              if (-1 < (int)local_138) {
                iVar3 = local_188->bias_term;
                local_b8 = (long)(local_188->weight_data).data + local_c8;
                local_178 = 0;
                local_158 = (Mat *)(ulong)(local_188->activation_type - 1);
                do {
                  if (-1 < (int)uVar17) {
                    local_170 = (float *)(local_188->activation_params).data;
                    local_160 = (local_188->bias_data).data;
                    local_168 = (long)(int)local_180 * (long)local_188->stride_d;
                    local_a8 = (long)(int)local_178 * (long)local_188->stride_h;
                    local_b0 = (long)local_188->stride_w;
                    uVar24 = 0;
                    do {
                      if (iVar3 == 0) {
                        fVar26 = 0.0;
                      }
                      else {
                        fVar26 = *(float *)((long)local_160 + local_198 * 4);
                      }
                      if (0 < (int)uVar2) {
                        lVar15 = (long)local_128.w *
                                 CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
                        uVar17 = 0;
                        lVar22 = local_b8;
                        do {
                          if (0 < (int)uVar14) {
                            uVar20 = 0;
                            do {
                              fVar26 = fVar26 + *(float *)(lVar22 + uVar20 * 4) *
                                                *(float *)((long)local_128.data +
                                                          (long)piVar13[uVar20] * 4 +
                                                          local_128.cstep *
                                                          CONCAT44(local_128.elemsize._4_4_,
                                                                   (undefined4)local_128.elemsize) *
                                                          uVar17 + uVar24 * local_b0 * 4 +
                                                                   lVar15 * local_a8 +
                                                                   local_128.h * local_168 * lVar15)
                              ;
                              uVar20 = uVar20 + 1;
                            } while (uVar14 != uVar20);
                          }
                          uVar17 = uVar17 + 1;
                          lVar22 = lVar22 + (long)(int)uVar14 * 4;
                        } while (uVar17 != uVar2);
                      }
                      fVar27 = fVar26;
                      if ((uint)local_158 < 6) {
                        switch((long)&switchD_003127f6::switchdataD_0031c478 +
                               (long)(int)(&switchD_003127f6::switchdataD_0031c478)[(long)local_158]
                              ) {
                        case 0x3127f8:
                          if (fVar26 <= 0.0) {
                            fVar27 = 0.0;
                          }
                          break;
                        case 0x312802:
                          local_88 = ZEXT416((uint)fVar26);
                          fVar26 = expf(fVar26);
                          fVar26 = logf(fVar26 + 1.0);
                          fVar26 = tanhf(fVar26);
                          uVar23 = local_130;
                          fVar27 = fVar26 * (float)local_88._0_4_;
                          break;
                        case 0x312841:
                          if (fVar26 <= *local_170) {
                            fVar26 = *local_170;
                          }
                          fVar27 = fVar26;
                          if (local_170[1] <= fVar26) {
                            fVar27 = local_170[1];
                          }
                          break;
                        case 0x312857:
                          fVar26 = expf(-fVar26);
                          uVar23 = local_130;
                          fVar27 = 1.0 / (fVar26 + 1.0);
                          break;
                        case 0x31288a:
                          fVar27 = (float)(~-(uint)(0.0 < fVar26) & (uint)*local_170 |
                                          -(uint)(0.0 < fVar26) & 0x3f800000) * fVar26;
                          break;
                        case 0x3128b5:
                          fVar1 = *local_170;
                          fVar25 = -local_170[1] / fVar1;
                          fVar27 = 0.0;
                          if ((fVar25 <= fVar26) &&
                             (fVar27 = fVar26, fVar26 <= fVar25 + 1.0 / fVar1)) {
                            fVar27 = (fVar1 * fVar26 + local_170[1]) * fVar26;
                          }
                        }
                      }
                      *(float *)(&local_1a0->lightmode + uVar24 * 4) = fVar27;
                      uVar24 = uVar24 + 1;
                    } while (uVar24 != uVar23);
                  }
                  local_1a0 = (Option *)(&local_1a0->lightmode + local_c0 * 4);
                  iVar4 = (int)local_178;
                  local_178 = (ulong)(iVar4 + 1);
                  uVar17 = local_140;
                } while (iVar4 != (int)local_138);
              }
              iVar3 = (int)local_180;
              local_180 = (ulong)(iVar3 + 1);
            } while (iVar3 != (int)local_148);
          }
          local_198 = local_198 + 1;
          local_190 = (ulong)(uint)((int)local_190 + local_14c);
        } while (local_198 != local_d0);
      }
      iVar18 = 0;
    }
    if (local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  piVar9 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_128.allocator == (Allocator *)0x0) {
        if (local_128.data != (void *)0x0) {
          free(local_128.data);
        }
      }
      else {
        (*(local_128.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar18;
}

Assistant:

int Convolution3D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extend_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extend_h = dilation_h * (kernel_h - 1) + 1;
    const int kernel_extend_d = dilation_d * (kernel_d - 1) + 1;

    Mat bottom_blob_bordered;
    Option opt_pad = opt;
    opt_pad.use_packing_layout = false;
    make_padding(bottom_blob, bottom_blob_bordered, opt_pad);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    d = bottom_blob_bordered.d;

    int outw = (w - kernel_extend_w) / stride_w + 1;
    int outh = (h - kernel_extend_h) / stride_h + 1;
    int outd = (d - kernel_extend_d) / stride_d + 1;

    const int maxk = kernel_w * kernel_h * kernel_d;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap0 = w * dilation_h - kernel_w * dilation_w;
        int gap1 = h * w * dilation_d - w * kernel_h * dilation_h;
        for (int z = 0; z < kernel_d; z++)
        {
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2 += dilation_w;
                }
                p2 += gap0;
            }
            p2 += gap1;
        }
    }

    top_blob.create(outw, outh, outd, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        float* outptr = top_blob.channel(p);

        for (int z = 0; z < outd; z++)
        {
            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[p];

                    const float* kptr = (const float*)weight_data + maxk * channels * p;

                    for (int q = 0; q < channels; q++)
                    {
                        const Mat m = bottom_blob_bordered.channel(q);
                        const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                        for (int l = 0; l < maxk; l++)
                        {
                            float val = sptr[space_ofs[l]];

                            float wt = kptr[l];
                            sum += val * wt;
                        }

                        kptr += maxk;
                    }

                    outptr[j] = activation_ss(sum, activation_type, activation_params);
                }

                outptr += outw;
            }
        }
    }

    return 0;
}